

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_policy.cpp
# Opt level: O2

void __thiscall
despot::RandomPolicy::RandomPolicy
          (RandomPolicy *this,DSPOMDP *model,vector<double,_std::allocator<double>_> *action_probs,
          ParticleLowerBound *bound)

{
  pointer pdVar1;
  long lVar2;
  double dVar3;
  
  DefaultPolicy::DefaultPolicy(&this->super_DefaultPolicy,model,bound);
  (this->super_DefaultPolicy).super_ScenarioLowerBound._vptr_ScenarioLowerBound =
       (_func_int **)&PTR__RandomPolicy_0019b350;
  std::vector<double,_std::allocator<double>_>::vector(&this->action_probs_,action_probs);
  pdVar1 = (action_probs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  dVar3 = 0.0;
  for (lVar2 = 0;
      (long)(action_probs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pdVar1 >> 3 != lVar2; lVar2 = lVar2 + 1) {
    dVar3 = dVar3 + pdVar1[lVar2];
  }
  if (ABS(dVar3 + -1.0) < 1e-08) {
    return;
  }
  __assert_fail("fabs(sum - 1.0) < 1.0e-8",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/core/builtin_policy.cpp"
                ,0x30,
                "despot::RandomPolicy::RandomPolicy(const DSPOMDP *, const vector<double> &, ParticleLowerBound *)"
               );
}

Assistant:

RandomPolicy::RandomPolicy(const DSPOMDP* model,
	const vector<double>& action_probs,
	ParticleLowerBound* bound) :
	DefaultPolicy(model, bound),
	action_probs_(action_probs) {
	double sum = 0;
	for (int i = 0; i < action_probs.size(); i++)
		sum += action_probs[i];
	assert(fabs(sum - 1.0) < 1.0e-8);
}